

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.h
# Opt level: O1

void __thiscall
GdlLangClass::AddFeatureValue
          (GdlLangClass *this,string *staFeat,string *staVal,GdlExpression *pexpVal,
          GrpLineAndFile *lnf)

{
  pointer *pppGVar1;
  iterator __position;
  GdlExpression *local_20;
  
  local_20 = pexpVal;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_vstaFeat,staFeat);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_vstaVal,staVal);
  __position._M_current =
       (this->m_vpexpVal).super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vpexpVal).super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<GdlExpression*,std::allocator<GdlExpression*>>::
    _M_realloc_insert<GdlExpression*const&>
              ((vector<GdlExpression*,std::allocator<GdlExpression*>> *)&this->m_vpexpVal,__position
               ,&local_20);
  }
  else {
    *__position._M_current = local_20;
    pppGVar1 = &(this->m_vpexpVal).
                super__Vector_base<GdlExpression_*,_std::allocator<GdlExpression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppGVar1 = *pppGVar1 + 1;
  }
  std::vector<GrpLineAndFile,_std::allocator<GrpLineAndFile>_>::push_back(&this->m_vlnf,lnf);
  return;
}

Assistant:

void AddFeatureValue(std::string staFeat, std::string staVal,
		GdlExpression * pexpVal, GrpLineAndFile lnf)
	{
		m_vstaFeat.push_back(staFeat);
		m_vstaVal.push_back(staVal);
		m_vpexpVal.push_back(pexpVal);
		m_vlnf.push_back(lnf);
		Assert(m_vstaFeat.size() == m_vstaVal.size());
		Assert(m_vstaFeat.size() == m_vpexpVal.size());
		Assert(m_vstaFeat.size() == m_vlnf.size());
	}